

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O2

void __thiscall
mognetwork::Packet::reinitialize(Packet *this,vector<char,_std::allocator<char>_> *data)

{
  ReadedDatas *this_00;
  
  this->m_readerPos = 0;
  this_00 = this->m_dataPack;
  if (this_00 == (ReadedDatas *)0x0) {
    this_00 = (ReadedDatas *)this->m_data;
    if (this_00 == (ReadedDatas *)0x0) goto LAB_0010c708;
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)this_00);
  }
  else {
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&(this_00->datas).super__Vector_base<char,_std::allocator<char>_>);
  }
  operator_delete(this_00);
LAB_0010c708:
  this->m_dataPack = (ReadedDatas *)0x0;
  this->m_data = data;
  return;
}

Assistant:

void Packet::reinitialize(std::vector<char>* data)
  {
    m_readerPos = 0;
    if (m_dataPack != NULL)
      delete m_dataPack;
    else if (m_data != NULL)
      delete m_data;
    m_dataPack = NULL;
    m_data = data;    
  }